

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O0

void __thiscall Nes_Apu::enable_nonlinear(Nes_Apu *this,double v)

{
  Blip_Synth<12,_1> *in_RDI;
  double tnd;
  double in_stack_ffffffffffffffd8;
  
  *(undefined1 *)((long)in_RDI[1].impulses + 0x23b) = 1;
  Blip_Synth<12,_1>::volume(in_RDI,in_stack_ffffffffffffffd8);
  nonlinear_tnd_gain();
  Blip_Synth<8,_1>::volume((Blip_Synth<8,_1> *)in_RDI,in_stack_ffffffffffffffd8);
  Blip_Synth<8,_1>::volume((Blip_Synth<8,_1> *)in_RDI,in_stack_ffffffffffffffd8);
  Blip_Synth<8,_1>::volume((Blip_Synth<8,_1> *)in_RDI,in_stack_ffffffffffffffd8);
  in_RDI->impulses[0xc] = 0;
  in_RDI->impulses[0xd] = 0;
  in_RDI->impulses[0x28] = 0;
  in_RDI->impulses[0x29] = 0;
  in_RDI->impulses[0x174] = 0;
  in_RDI->impulses[0x175] = 0;
  in_RDI->impulses[0x44] = 0;
  in_RDI->impulses[0x45] = 0;
  in_RDI[1].impulses[0x108] = 0;
  in_RDI[1].impulses[0x109] = 0;
  return;
}

Assistant:

void Nes_Apu::enable_nonlinear( double v )
{
	dmc.nonlinear = true;
	square_synth.volume( 1.3 * 0.25751258 / 0.742467605 * 0.25 / amp_range * v );
	
	const double tnd = 0.48 / 202 * nonlinear_tnd_gain();
	triangle.synth.volume( 3.0 * tnd );
	noise.synth.volume( 2.0 * tnd );
	dmc.synth.volume( tnd );
	
	square1 .last_amp = 0;
	square2 .last_amp = 0;
	triangle.last_amp = 0;
	noise   .last_amp = 0;
	dmc     .last_amp = 0;
}